

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ScopedElement * __thiscall
doctest::anon_unknown_15::XmlWriter::ScopedElement::writeText
          (ScopedElement *this,string *text,bool indent)

{
  bool indent_local;
  string *text_local;
  ScopedElement *this_local;
  
  XmlWriter::writeText(this->m_writer,text,indent);
  return this;
}

Assistant:

XmlWriter::ScopedElement& XmlWriter::ScopedElement::writeText( std::string const& text, bool indent ) {
        m_writer->writeText( text, indent );
        return *this;
    }